

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridGlobal.cpp
# Opt level: O2

void __thiscall
TasGrid::GridGlobal::loadConstructedPoint(GridGlobal *this,double *x,int numx,double *y)

{
  int iVar1;
  DynamicConstructorDataGlobal *pDVar2;
  GridGlobal *pGVar3;
  pointer tensor;
  AddPointResult AVar4;
  ulong uVar5;
  double dVar6;
  vector<int,_std::allocator<int>_> idx;
  allocator_type local_a9;
  double *local_a8;
  GridGlobal *local_a0;
  OneDimensionalWrapper *local_98;
  long local_90;
  ulong local_88;
  _Vector_base<int,_std::allocator<int>_> local_80;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  iVar1 = (this->super_BaseCanonicalGrid).num_dimensions;
  local_98 = &this->wrapper;
  uVar5 = 0;
  if (0 < numx) {
    uVar5 = (ulong)(uint)numx;
  }
  local_90 = (long)(this->super_BaseCanonicalGrid).num_outputs << 3;
  local_a8 = y;
  local_a0 = this;
  while (pGVar3 = local_a0, uVar5 != 0) {
    local_88 = uVar5 - 1;
    getMultiIndex((vector<int,_std::allocator<int>_> *)&local_48,local_a0,x);
    pDVar2 = (pGVar3->dynamic_values)._M_t.
             super___uniq_ptr_impl<TasGrid::DynamicConstructorDataGlobal,_std::default_delete<TasGrid::DynamicConstructorDataGlobal>_>
             ._M_t.
             super__Tuple_impl<0UL,_TasGrid::DynamicConstructorDataGlobal_*,_std::default_delete<TasGrid::DynamicConstructorDataGlobal>_>
             .super__Head_base<0UL,_TasGrid::DynamicConstructorDataGlobal_*,_false>._M_head_impl;
    ::std::vector<double,std::allocator<double>>::vector<double_const*,void>
              ((vector<double,std::allocator<double>> *)&local_80,local_a8,
               local_a8 + (pGVar3->super_BaseCanonicalGrid).num_outputs,&local_a9);
    AVar4 = DynamicConstructorDataGlobal::addNewNode
                      (pDVar2,(vector<int,_std::allocator<int>_> *)&local_48,
                       (vector<double,_std::allocator<double>_> *)&local_80);
    ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&local_80);
    pGVar3 = local_a0;
    if (AVar4 == tensor_missing) {
      pDVar2 = (local_a0->dynamic_values)._M_t.
               super___uniq_ptr_impl<TasGrid::DynamicConstructorDataGlobal,_std::default_delete<TasGrid::DynamicConstructorDataGlobal>_>
               ._M_t.
               super__Tuple_impl<0UL,_TasGrid::DynamicConstructorDataGlobal_*,_std::default_delete<TasGrid::DynamicConstructorDataGlobal>_>
               .super__Head_base<0UL,_TasGrid::DynamicConstructorDataGlobal_*,_false>._M_head_impl;
      OneDimensionalWrapper::getLevels
                ((vector<int,_std::allocator<int>_> *)&local_80,local_98,
                 (vector<int,_std::allocator<int>_> *)&local_48);
      tensor = local_80._M_impl.super__Vector_impl_data._M_start;
      local_68._8_8_ = 0;
      local_68._M_unused._M_function_pointer = (_func_void *)pGVar3;
      local_50 = ::std::
                 _Function_handler<int_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/SparseGrids/tsgGridGlobal.cpp:508:70)>
                 ::_M_invoke;
      local_58 = ::std::
                 _Function_handler<int_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/SparseGrids/tsgGridGlobal.cpp:508:70)>
                 ::_M_manager;
      dVar6 = DynamicConstructorDataGlobal::getMaxTensorWeight
                        ((pGVar3->dynamic_values)._M_t.
                         super___uniq_ptr_impl<TasGrid::DynamicConstructorDataGlobal,_std::default_delete<TasGrid::DynamicConstructorDataGlobal>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_TasGrid::DynamicConstructorDataGlobal_*,_std::default_delete<TasGrid::DynamicConstructorDataGlobal>_>
                         .super__Head_base<0UL,_TasGrid::DynamicConstructorDataGlobal_*,_false>.
                         _M_head_impl);
      DynamicConstructorDataGlobal::addTensor
                (pDVar2,tensor,(function<int_(int)> *)&local_68,dVar6 + 1.0);
      ::std::_Function_base::~_Function_base((_Function_base *)&local_68);
      ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_80);
    }
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
    local_a8 = (double *)((long)local_a8 + local_90);
    x = x + iVar1;
    uVar5 = local_88;
  }
  loadConstructedTensors(local_a0);
  return;
}

Assistant:

void GridGlobal::loadConstructedPoint(const double x[], int numx, const double y[]){
    Utils::Wrapper2D<const double> wrapx(num_dimensions, x);
    Utils::Wrapper2D<const double> wrapy(num_outputs, y);
    for(int i=0; i<numx; i++){
        std::vector<int> idx = getMultiIndex(wrapx.getStrip(i));
        if (dynamic_values->addNewNode(idx, std::vector<double>(wrapy.getStrip(i), wrapy.getStrip(i) + num_outputs))
            == DynamicConstructorDataGlobal::AddPointResult::tensor_missing){
            dynamic_values->addTensor(wrapper.getLevels(idx).data(), [&](int l)->int{ return wrapper.getNumPoints(l); },
                                      dynamic_values->getMaxTensorWeight() + 1.0);
        }
    }
    loadConstructedTensors();
}